

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

void __thiscall
absl::lts_20240722::inlined_vector_internal::
AllocationTransaction<std::allocator<absl::lts_20240722::status_internal::Payload>_>::
~AllocationTransaction
          (AllocationTransaction<std::allocator<absl::lts_20240722::status_internal::Payload>_>
           *this)

{
  Payload *pPVar1;
  
  pPVar1 = (this->allocator_data_).
           super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_absl::lts_20240722::status_internal::Payload_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
           .super_Storage<absl::lts_20240722::status_internal::Payload_*,_1UL,_false>.value;
  if (pPVar1 != (Payload *)0x0) {
    operator_delete(pPVar1,this->capacity_ * 0x30);
    return;
  }
  return;
}

Assistant:

~AllocationTransaction() {
    if (DidAllocate()) {
      MallocAdapter<A>::Deallocate(GetAllocator(), GetData(), GetCapacity());
    }
  }